

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void check_label_register(Context *ctx,int arg,char *opcode)

{
  int iVar1;
  byte bVar2;
  undefined4 in_register_00000034;
  
  iVar1 = ctx->source_args[0].regnum;
  if (ctx->source_args[0].regtype != REG_TYPE_LABEL) {
    failf(ctx,"%s with a non-label register specified",CONCAT44(in_register_00000034,arg));
  }
  if (ctx->major_ver < 2) {
    failf(ctx,"%s not supported in Shader Model 1",CONCAT44(in_register_00000034,arg));
  }
  bVar2 = 1;
  if (ctx->minor_ver != 0xff) {
    bVar2 = ctx->minor_ver;
  }
  if (0x7ff < iVar1 && 0x20000 < ((uint)bVar2 | (uint)ctx->major_ver << 0x10)) {
    failf(ctx,"%s","label register number must be <= 2047");
  }
  if (0xf < iVar1) {
    failf(ctx,"%s","label register number must be <= 15");
    return;
  }
  return;
}

Assistant:

static void check_label_register(Context *ctx, int arg, const char *opcode)
{
    const SourceArgInfo *info = &ctx->source_args[arg];
    const RegisterType regtype = info->regtype;
    const int regnum = info->regnum;

    if (regtype != REG_TYPE_LABEL)
        failf(ctx, "%s with a non-label register specified", opcode);
    if (!shader_version_atleast(ctx, 2, 0))
        failf(ctx, "%s not supported in Shader Model 1", opcode);
    if ((shader_version_atleast(ctx, 2, 255)) && (regnum > 2047))
        fail(ctx, "label register number must be <= 2047");
    if (regnum > 15)
        fail(ctx, "label register number must be <= 15");
}